

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorkerJob.h
# Opt level: O0

void __thiscall
xmrig::WorkerJob<1UL>::save(WorkerJob<1UL> *this,Job *job,uint32_t reserveCount,Backend backend)

{
  uint32_t uVar1;
  char *pcVar2;
  uint8_t *__dest;
  uint8_t *__s;
  size_t __n;
  uint32_t *puVar3;
  uint32_t in_ECX;
  int in_EDX;
  int __c;
  int __c_00;
  int __c_01;
  int __c_02;
  WorkerJob<1UL> *in_RSI;
  WorkerJob<1UL> *pWVar4;
  WorkerJob<1UL> *this_00;
  WorkerJob<1UL> *in_RDI;
  Job *other;
  Job *pJVar5;
  
  pWVar4 = in_RSI;
  pcVar2 = Job::index((Job *)in_RSI,(char *)in_RSI,in_EDX);
  in_RDI->m_index = (uint8_t)pcVar2;
  other = in_RDI->m_jobs;
  this_00 = in_RSI;
  index(in_RDI,(char *)pWVar4,__c);
  pWVar4 = this_00;
  Job::operator=((Job *)this_00,other);
  pcVar2 = index(in_RDI,(char *)this_00,__c_00);
  in_RDI->m_rounds[(ulong)pcVar2 & 0xff] = 0;
  pJVar5 = in_RDI->m_jobs;
  pcVar2 = index(in_RDI,(char *)this_00,__c_01);
  Job::setBackend(pJVar5 + ((ulong)pcVar2 & 0xff),in_ECX);
  uVar1 = (uint32_t)((ulong)pJVar5 >> 0x20);
  __dest = blob(pWVar4);
  __s = Job::blob((Job *)in_RSI);
  __n = Job::size((Job *)in_RSI);
  memcpy(__dest,__s,__n);
  index(in_RDI,(char *)__s,__c_02);
  nonce(pWVar4,(size_t)other);
  uVar1 = Nonce::next((uint8_t)((ulong)__dest >> 0x38),(uint32_t)__dest,uVar1);
  puVar3 = nonce(pWVar4,(size_t)other);
  *puVar3 = uVar1;
  return;
}

Assistant:

inline void xmrig::WorkerJob<1>::save(const Job &job, uint32_t reserveCount, Nonce::Backend backend)
{
    m_index           = job.index();
    m_jobs[index()]   = job;
    m_rounds[index()] = 0;

    m_jobs[index()].setBackend(backend);

    memcpy(blob(), job.blob(), job.size());
    *nonce() = Nonce::next(index(), *nonce(), reserveCount);
}